

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-rinex.c
# Opt level: O0

int handle_observation_definition(ingest_info *info,char *line)

{
  int iVar1;
  coda_type_record *pcVar2;
  coda_type_record_field *pcVar3;
  long lVar4;
  coda_mem_record *type;
  coda_mem_data *pcVar5;
  coda_mem_array *type_00;
  char *pcVar6;
  coda_type_array *pcVar7;
  long *in_FS_OFFSET;
  long local_70;
  long expected_line_length;
  long linelength;
  char str [4];
  int i;
  int64_t num_types;
  char *fieldname;
  coda_mem_array *descriptor_array;
  coda_mem_record *sys;
  coda_dynamic_type *value;
  coda_type_record_field *field;
  satellite_info *sat_info;
  char *line_local;
  ingest_info *info_local;
  
  switch(*line) {
  case 'E':
    field = (coda_type_record_field *)&info->galileo;
    num_types = (int64_t)anon_var_dwarf_fe32;
    break;
  default:
    coda_set_error(-0x16,
                   "invalid satellite system for observation type definition (line: %ld, byte offset: %ld)"
                   ,info->linenumber,info->offset);
    return -1;
  case 'G':
    field = (coda_type_record_field *)&info->gps;
    num_types = (long)"sv_health_gps" + 10;
    break;
  case 'R':
    field = (coda_type_record_field *)&info->glonass;
    num_types = (int64_t)anon_var_dwarf_fe26;
    break;
  case 'S':
    field = (coda_type_record_field *)&info->sbas;
    num_types = (int64_t)anon_var_dwarf_fe3e;
  }
  if (field->type == (coda_type *)0x0) {
    pcVar2 = coda_type_record_new(coda_format_rinex);
    field->type = (coda_type *)pcVar2;
    pcVar3 = coda_type_record_field_new("number");
    coda_type_record_field_set_type
              (pcVar3,*(coda_type **)(*(long *)(*in_FS_OFFSET + -0x118) + 0x180));
    coda_type_record_add_field((coda_type_record *)field->type,pcVar3);
    lVar4 = coda_ascii_parse_int64(line + 3,3,(int64_t *)str,0);
    if (lVar4 < 0) {
      coda_add_error_message(" (line: %ld, byte offset: %ld)",info->linenumber,info->offset + 3);
      info_local._4_4_ = -1;
    }
    else {
      type = coda_mem_record_new(*(coda_type_record **)(*(long *)(*in_FS_OFFSET + -0x118) + 0xf8),
                                 (coda_dynamic_type *)0x0);
      pcVar5 = coda_mem_char_new(*(coda_type_text **)(*(long *)(*in_FS_OFFSET + -0x118) + 0xd8),
                                 (coda_dynamic_type *)0x0,info->product,*line);
      coda_mem_record_add_field(type,"code",(coda_dynamic_type *)pcVar5,0);
      pcVar5 = coda_mem_int16_new(*(coda_type_number **)(*(long *)(*in_FS_OFFSET + -0x118) + 0xe0),
                                  (coda_dynamic_type *)0x0,info->product,(int16_t)_str);
      coda_mem_record_add_field(type,"num_obs_types",(coda_dynamic_type *)pcVar5,0);
      type_00 = coda_mem_array_new(*(coda_type_array **)(*(long *)(*in_FS_OFFSET + -0x118) + 0xf0),
                                   (coda_dynamic_type *)0x0);
      pcVar6 = (char *)malloc(_str << 3);
      field->real_name = pcVar6;
      if (field->real_name == (char *)0x0) {
        coda_set_error(-1,"out of memory (could not allocate %lu bytes) (%s:%u)",_str << 3,
                       "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-rinex.c"
                       ,0x776);
        info_local._4_4_ = -1;
      }
      else {
        *(int *)&field->name = (int)_str;
        for (linelength._4_4_ = 0; linelength._4_4_ < _str; linelength._4_4_ = linelength._4_4_ + 1)
        {
          pcVar6 = field->real_name + (long)linelength._4_4_ * 8;
          pcVar6[0] = '\0';
          pcVar6[1] = '\0';
          pcVar6[2] = '\0';
          pcVar6[3] = '\0';
          pcVar6[4] = '\0';
          pcVar6[5] = '\0';
          pcVar6[6] = '\0';
          pcVar6[7] = '\0';
        }
        for (linelength._4_4_ = 0; linelength._4_4_ < _str; linelength._4_4_ = linelength._4_4_ + 1)
        {
          if ((linelength._4_4_ % 0xd == 0) && (0 < linelength._4_4_)) {
            local_70 = 0x3a;
            lVar4 = ftell((FILE *)info->f);
            info->offset = lVar4;
            info->linenumber = info->linenumber + 1;
            iVar1 = get_line(info->f,line);
            lVar4 = (long)iVar1;
            if (lVar4 < 0) {
              coda_dynamic_type_delete((coda_dynamic_type *)type);
              coda_dynamic_type_delete((coda_dynamic_type *)type_00);
              return -1;
            }
            if (_str - linelength._4_4_ < 0xd) {
              local_70 = ((_str - linelength._4_4_) % 0xd) * 4 + 6;
            }
            if (lVar4 < local_70) {
              coda_set_error(-0x16,
                             "header line length (%ld) too short (line: %ld, byte offset: %ld)",
                             lVar4,info->linenumber,info->offset);
              return -1;
            }
          }
          lVar4 = (long)((linelength._4_4_ % 0xd) * 4 + 7);
          linelength._0_2_ = *(undefined2 *)(line + lVar4);
          linelength._2_1_ = line[lVar4 + 2];
          linelength._3_1_ = 0;
          pcVar5 = coda_mem_string_new(*(coda_type_text **)
                                        (*(long *)(*in_FS_OFFSET + -0x118) + 0xe8),
                                       (coda_dynamic_type *)0x0,info->product,(char *)&linelength);
          coda_mem_array_add_element(type_00,(coda_dynamic_type *)pcVar5);
          pcVar3 = coda_type_record_field_new((char *)&linelength);
          coda_type_record_field_set_type
                    (pcVar3,*(coda_type **)(*(long *)(*in_FS_OFFSET + -0x118) + 0x1a0));
          coda_type_record_add_field((coda_type_record *)field->type,pcVar3);
          pcVar6 = strdup((char *)&linelength);
          *(char **)(field->real_name + (long)linelength._4_4_ * 8) = pcVar6;
          if (*(long *)(field->real_name + (long)linelength._4_4_ * 8) == 0) {
            coda_set_error(-1,"out of memory (could not duplicate string) (%s:%u)",
                           "/workspace/llm4binary/github/license_c_cmakelists/stcorp[P]coda/libcoda/coda-rinex.c"
                           ,0x7ab);
            return -1;
          }
        }
        coda_mem_record_add_field(type,"descriptor",(coda_dynamic_type *)type_00,0);
        coda_mem_array_add_element(info->sys_array,(coda_dynamic_type *)type);
        pcVar7 = coda_type_array_new(coda_format_rinex);
        *(coda_type_array **)&field->hidden = pcVar7;
        coda_type_array_add_variable_dimension
                  (*(coda_type_array **)&field->hidden,(coda_expression *)0x0);
        coda_type_array_set_base_type(*(coda_type_array **)&field->hidden,field->type);
        pcVar3 = coda_type_record_field_new((char *)num_types);
        coda_type_record_field_set_type(pcVar3,*(coda_type **)&field->hidden);
        coda_type_record_add_field(info->epoch_record_definition,pcVar3);
        info_local._4_4_ = 0;
      }
    }
  }
  else {
    coda_set_error(-0x16,
                   "multiple observation type definitions for type \'%c\' (line: %ld, byte offset: %ld)"
                   ,(ulong)(uint)(int)*line,info->linenumber,info->offset);
    info_local._4_4_ = -1;
  }
  return info_local._4_4_;
}

Assistant:

static int handle_observation_definition(ingest_info *info, char *line)
{
    satellite_info *sat_info;
    coda_type_record_field *field;
    coda_dynamic_type *value;
    coda_mem_record *sys;
    coda_mem_array *descriptor_array;
    const char *fieldname = NULL;
    int64_t num_types;
    int i;

    switch (line[0])
    {
        case 'G':      /* GPS */
            sat_info = &info->gps;
            fieldname = "gps";
            break;
        case 'R':      /* GLONASS */
            sat_info = &info->glonass;
            fieldname = "glonass";
            break;
        case 'E':      /* Galileo */
            sat_info = &info->galileo;
            fieldname = "galileo";
            break;
        case 'S':      /* SBAS */
            sat_info = &info->sbas;
            fieldname = "sbas";
            break;
        default:
            coda_set_error(CODA_ERROR_FILE_READ, "invalid satellite system for observation type definition "
                           "(line: %ld, byte offset: %ld)", info->linenumber, info->offset);
            return -1;
    }

    if (sat_info->sat_obs_definition != NULL)
    {
        coda_set_error(CODA_ERROR_FILE_READ, "multiple observation type definitions for type '%c' "
                       "(line: %ld, byte offset: %ld)", line[0], info->linenumber, info->offset);
        return -1;
    }
    sat_info->sat_obs_definition = coda_type_record_new(coda_format_rinex);
    field = coda_type_record_field_new("number");
    coda_type_record_field_set_type(field, rinex_type[rinex_satellite_number]);
    coda_type_record_add_field(sat_info->sat_obs_definition, field);

    if (coda_ascii_parse_int64(&line[3], 3, &num_types, 0) < 0)
    {
        coda_add_error_message(" (line: %ld, byte offset: %ld)", info->linenumber, info->offset + 3);
        return -1;
    }
    sys = coda_mem_record_new((coda_type_record *)rinex_type[rinex_sys], NULL);
    value = (coda_dynamic_type *)coda_mem_char_new((coda_type_text *)rinex_type[rinex_sys_code], NULL, info->product,
                                                   line[0]);
    coda_mem_record_add_field(sys, "code", value, 0);
    value = (coda_dynamic_type *)coda_mem_int16_new((coda_type_number *)rinex_type[rinex_sys_num_obs_types],
                                                    NULL, info->product, (int16_t)num_types);
    coda_mem_record_add_field(sys, "num_obs_types", value, 0);
    descriptor_array = coda_mem_array_new((coda_type_array *)rinex_type[rinex_sys_descriptor_array], NULL);

    sat_info->observable = malloc((size_t)num_types * sizeof(char *));
    if (sat_info->observable == NULL)
    {
        coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not allocate %lu bytes) (%s:%u)",
                       (long)num_types * sizeof(char *), __FILE__, __LINE__);
        return -1;
    }
    sat_info->num_observables = (int)num_types;
    for (i = 0; i < num_types; i++)
    {
        sat_info->observable[i] = NULL;
    }

    for (i = 0; i < num_types; i++)
    {
        char str[4];

        if (i % 13 == 0 && i > 0)
        {
            long linelength;
            long expected_line_length = 6 + 13 * 4;

            /* read next line */
            info->offset = ftell(info->f);
            info->linenumber++;
            linelength = get_line(info->f, line);
            if (linelength < 0)
            {
                coda_dynamic_type_delete((coda_dynamic_type *)sys);
                coda_dynamic_type_delete((coda_dynamic_type *)descriptor_array);
                return -1;
            }
            if (num_types - i < 13)
            {
                expected_line_length = 6 + ((num_types - i) % 13) * 4;
            }
            if (linelength < expected_line_length)
            {
                coda_set_error(CODA_ERROR_FILE_READ, "header line length (%ld) too short (line: %ld, byte offset: %ld)",
                               linelength, info->linenumber, info->offset);
                return -1;
            }
        }
        memcpy(str, &line[6 + (i % 13) * 4 + 1], 3);
        str[3] = '\0';
        value = (coda_dynamic_type *)coda_mem_string_new((coda_type_text *)rinex_type[rinex_sys_descriptor], NULL,
                                                         info->product, str);
        coda_mem_array_add_element(descriptor_array, value);

        field = coda_type_record_field_new(str);
        coda_type_record_field_set_type(field, rinex_type[rinex_observation_record]);
        coda_type_record_add_field(sat_info->sat_obs_definition, field);

        sat_info->observable[i] = strdup(str);
        if (sat_info->observable[i] == NULL)
        {
            coda_set_error(CODA_ERROR_OUT_OF_MEMORY, "out of memory (could not duplicate string) (%s:%u)", __FILE__,
                           __LINE__);
            return -1;
        }
    }

    /* update header */
    coda_mem_record_add_field(sys, "descriptor", (coda_dynamic_type *)descriptor_array, 0);
    coda_mem_array_add_element(info->sys_array, (coda_dynamic_type *)sys);

    /* update epoch record definition */
    sat_info->sat_obs_array_definition = coda_type_array_new(coda_format_rinex);
    coda_type_array_add_variable_dimension((coda_type_array *)sat_info->sat_obs_array_definition, NULL);
    coda_type_array_set_base_type(sat_info->sat_obs_array_definition, (coda_type *)sat_info->sat_obs_definition);

    field = coda_type_record_field_new(fieldname);
    coda_type_record_field_set_type(field, (coda_type *)sat_info->sat_obs_array_definition);
    coda_type_record_add_field(info->epoch_record_definition, field);

    return 0;
}